

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SparseBitVector.h
# Opt level: O0

BVSparseNode * __thiscall
BVSparse<Memory::HeapAllocator>::DeleteNode
          (BVSparse<Memory::HeapAllocator> *this,BVSparseNode *node,bool bResetLastUsed)

{
  BVSparseNode *pBVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  BVSparseNode *next;
  bool bResetLastUsed_local;
  BVSparseNode *node_local;
  BVSparse<Memory::HeapAllocator> *this_local;
  
  this->lastFoundIndex = (Type_conflict)0x0;
  pBVar1 = node->next;
  QueueInFreeList(this,node);
  if (bResetLastUsed) {
    this->lastUsedNodePrevNextField = &this->head;
  }
  else if ((BVSparseNode *)this->lastUsedNodePrevNextField == node) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SparseBitVector.h"
                       ,0x209,"(this->lastUsedNodePrevNextField != &node->next)",
                       "this->lastUsedNodePrevNextField != &node->next");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  return pBVar1;
}

Assistant:

BVSparseNode<TAllocator> *
BVSparse<TAllocator>::DeleteNode(BVSparseNode *node, bool bResetLastUsed)
{
    this->lastFoundIndex = nullptr;
    BVSparseNode *next = node->next;
    QueueInFreeList(node);

    if (bResetLastUsed)
    {
        this->lastUsedNodePrevNextField = &this->head;
    }
    else
    {
        Assert(this->lastUsedNodePrevNextField != &node->next);
    }
    return next;
}